

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

bool __thiscall
irr::core::string<unsigned_long>::operator==
          (string<unsigned_long> *this,string<unsigned_long> *other)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    lVar1 = *(long *)((long)this->array + lVar4);
    bVar3 = 1;
    if ((lVar1 == 0) || (lVar2 = *(long *)((long)other->array + lVar4), lVar2 == 0))
    goto LAB_0061d388;
    lVar4 = lVar4 + 8;
  } while (lVar1 == lVar2);
  bVar3 = 0;
LAB_0061d388:
  return (bool)(this->used == other->used & bVar3);
}

Assistant:

bool operator ==(const string<T>& other) const
	{
		for(s32 i=0; array[i] && other.array[i]; ++i)
			if (array[i] != other.array[i])
				return false;

		return used == other.used;
	}